

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialog::setNameFilters(QFileDialog *this,QStringList *filters)

{
  bool bVar1;
  QFileDialogPrivate *filters_00;
  const_iterator o;
  QFileDialogOptions *pQVar2;
  Ui_QFileDialog *pUVar3;
  QList<QString> *in_RSI;
  QFileDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  QString *filter;
  QStringList *__range1;
  QFileDialogPrivate *d;
  const_iterator __end1;
  const_iterator __begin1;
  QStringList cleanedFilters;
  QStringList *in_stack_ffffffffffffff58;
  QComboBox *texts;
  int in_stack_ffffffffffffff9c;
  QFileDialogPrivate *in_stack_ffffffffffffffa0;
  qsizetype in_stack_ffffffffffffffc8;
  const_iterator local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  filters_00 = d_func((QFileDialog *)0x7541d5);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0x754214);
  QList<QString>::size(in_RSI);
  QList<QString>::reserve(in_RSI,in_stack_ffffffffffffffc8);
  local_28.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = QList<QString>::begin((QList<QString> *)in_RDI);
  o = QList<QString>::end((QList<QString> *)in_RDI);
  while (bVar1 = QList<QString>::const_iterator::operator!=(&local_28,o), bVar1) {
    QList<QString>::const_iterator::operator*(&local_28);
    QString::simplified((QString *)in_stack_ffffffffffffff58);
    QList<QString>::operator<<((QList<QString> *)in_RDI,(rvalue_ref)in_stack_ffffffffffffff58);
    QString::~QString((QString *)0x7542f1);
    QList<QString>::const_iterator::operator++(&local_28);
  }
  pQVar2 = QSharedPointer<QFileDialogOptions>::operator->
                     ((QSharedPointer<QFileDialogOptions> *)0x754311);
  QFileDialogOptions::setNameFilters((QList_conflict2 *)pQVar2);
  bVar1 = QFileDialogPrivate::usingWidgets(in_RDI);
  if (bVar1) {
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
              (&filters_00->qFileDialogUi);
    QComboBox::clear((QComboBox *)in_stack_ffffffffffffffa0);
    bVar1 = QList<QString>::isEmpty((QList<QString> *)0x754366);
    if (!bVar1) {
      bVar1 = testOption((QFileDialog *)in_RDI,(Option)((ulong)in_stack_ffffffffffffff58 >> 0x20));
      if (bVar1) {
        pUVar3 = QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
                           (&filters_00->qFileDialogUi);
        texts = pUVar3->fileTypeCombo;
        qt_strip_filters((QStringList *)filters_00);
        QComboBox::addItems((QComboBox *)in_RDI,(QStringList *)texts);
        QList<QString>::~QList((QList<QString> *)0x7543d4);
      }
      else {
        QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
                  (&filters_00->qFileDialogUi);
        QComboBox::addItems((QComboBox *)in_RDI,in_stack_ffffffffffffff58);
      }
      QFileDialogPrivate::useNameFilter(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    }
  }
  QList<QString>::~QList((QList<QString> *)0x75441c);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileDialog::setNameFilters(const QStringList &filters)
{
    Q_D(QFileDialog);
    QStringList cleanedFilters;
    cleanedFilters.reserve(filters.size());
    for (const QString &filter : filters)
        cleanedFilters << filter.simplified();

    d->options->setNameFilters(cleanedFilters);

    if (!d->usingWidgets())
        return;

    d->qFileDialogUi->fileTypeCombo->clear();
    if (cleanedFilters.isEmpty())
        return;

    if (testOption(HideNameFilterDetails))
        d->qFileDialogUi->fileTypeCombo->addItems(qt_strip_filters(cleanedFilters));
    else
        d->qFileDialogUi->fileTypeCombo->addItems(cleanedFilters);

    d->useNameFilter(0);
}